

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall ncnn::Input::Input(Input *this)

{
  Layer *in_RDI;
  
  Layer::Layer(in_RDI);
  in_RDI->_vptr_Layer = (_func_int **)&PTR__Input_009b6958;
  in_RDI->one_blob_only = true;
  in_RDI->support_inplace = true;
  in_RDI->support_vulkan = true;
  in_RDI->support_packing = true;
  in_RDI->support_bf16_storage = true;
  in_RDI->support_image_storage = true;
  return;
}

Assistant:

Input::Input()
{
    one_blob_only = true;
    support_inplace = true;
    support_vulkan = true;
    support_packing = true;
    support_bf16_storage = true;
    support_image_storage = true;
}